

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block_graph.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
IRT::getReorderedIndecies
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
          *basicBlocks)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  const_reference this;
  pointer basicBlock;
  size_type sVar4;
  vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  *in_RDX;
  reference rVar5;
  reference local_b8;
  int local_a4;
  undefined1 auStack_a0 [4];
  int i_1;
  _Bit_type local_98;
  int local_8c;
  undefined1 local_85;
  int i;
  allocator<bool> local_72;
  bool local_71;
  undefined1 local_70 [8];
  vector<bool,_std::allocator<bool>_> usedBlocks;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  labelToBlockIndexMap;
  vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  *basicBlocks_local;
  vector<int,_std::allocator<int>_> *newOrder;
  
  buildLabelToBlockIndexMap_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)&usedBlocks.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_end_of_storage,(IRT *)basicBlocks,in_RDX);
  sVar2 = std::
          vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
          ::size(basicBlocks);
  local_71 = false;
  std::allocator<bool>::allocator(&local_72);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_70,sVar2,&local_71,&local_72);
  std::allocator<bool>::~allocator(&local_72);
  local_85 = 0;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  local_8c = 0;
  while( true ) {
    uVar3 = (ulong)local_8c;
    sVar2 = std::
            vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
            ::size(basicBlocks);
    if (sVar2 <= uVar3) break;
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_70,(long)local_8c);
    _auStack_a0 = rVar5;
    bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)auStack_a0);
    if (!bVar1) {
      this = std::
             vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
             ::operator[](basicBlocks,(long)local_8c);
      basicBlock = std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>::
                   get(this);
      bVar1 = isCJumpBasicBlock(basicBlock);
      if (bVar1) {
        dfs(local_8c,basicBlocks,
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)&usedBlocks.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage,
            (vector<bool,_std::allocator<bool>_> *)local_70,__return_storage_ptr__);
      }
    }
    local_8c = local_8c + 1;
  }
  local_a4 = 0;
  while( true ) {
    uVar3 = (ulong)local_a4;
    sVar2 = std::
            vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
            ::size(basicBlocks);
    if (sVar2 <= uVar3) break;
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_70,(long)local_a4);
    local_b8 = rVar5;
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_b8);
    if (!bVar1) {
      dfs(local_a4,basicBlocks,
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *)&usedBlocks.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
              ._M_end_of_storage,(vector<bool,_std::allocator<bool>_> *)local_70,
          __return_storage_ptr__);
    }
    local_a4 = local_a4 + 1;
  }
  sVar2 = std::vector<int,_std::allocator<int>_>::size(__return_storage_ptr__);
  sVar4 = std::
          vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
          ::size(basicBlocks);
  if (sVar2 == sVar4) {
    local_85 = 1;
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_70);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *)&usedBlocks.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_end_of_storage);
    return __return_storage_ptr__;
  }
  __assert_fail("newOrder.size() == basicBlocks.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/basic_blocks/basic_block_graph.cpp"
                ,0x84,
                "std::vector<int> IRT::getReorderedIndecies(const std::vector<std::unique_ptr<CStatementList>> &)"
               );
}

Assistant:

std::vector<int> getReorderedIndecies(const std::vector<std::unique_ptr<CStatementList>> &basicBlocks) {
        std::map<std::string, int> labelToBlockIndexMap = buildLabelToBlockIndexMap(basicBlocks);
        std::vector<bool> usedBlocks(basicBlocks.size(), false);

        std::vector<int> newOrder;

        // try use cjumps firstly
        for (int i = 0; i < basicBlocks.size(); ++i) {
            if (usedBlocks[i]) {
                continue;
            }

            if (!isCJumpBasicBlock(basicBlocks[i].get())) {
                continue;
            }

            dfs(i, basicBlocks, labelToBlockIndexMap, usedBlocks, newOrder);
        }

        // add not cjump
        for (int i = 0; i < basicBlocks.size(); ++i) {
            if (usedBlocks[i]) {
                continue;
            }

            dfs(i, basicBlocks, labelToBlockIndexMap, usedBlocks, newOrder);
        }

        assert(newOrder.size() == basicBlocks.size());
        return newOrder;
    }